

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluContextInfo.cpp
# Opt level: O2

ContextInfo * glu::ContextInfo::create(RenderContext *context)

{
  uint uVar1;
  ES2ContextInfo *this;
  
  uVar1 = (*context->_vptr_RenderContext[2])();
  if ((uVar1 & 0x3ff) == 2) {
    this = (ES2ContextInfo *)operator_new(0xe0);
    ES2ContextInfo::ES2ContextInfo(this,context);
  }
  else {
    this = (ES2ContextInfo *)operator_new(0x68);
    ContextInfo((ContextInfo *)this,context);
  }
  return &this->super_ContextInfo;
}

Assistant:

ContextInfo* ContextInfo::create (const RenderContext& context)
{
	// ES2 uses special variant that checks support for various shader features
	// by trying to compile shader programs.
	if (context.getType().getAPI() == ApiType::es(2,0))
		return new ES2ContextInfo(context);

	return new ContextInfo(context);
}